

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_addtimeout(curl_llist *timeoutlist,timeval *stamp)

{
  curl_llist_element *pcVar1;
  __suseconds_t _Var2;
  uint uVar3;
  CURLMcode CVar4;
  timeval *p;
  size_t sVar5;
  long lVar6;
  curl_llist *pcVar8;
  curl_llist_element *e;
  timeval *ptVar7;
  
  p = (timeval *)(*Curl_cmalloc)(0x10);
  ptVar7 = p;
  if (p != (timeval *)0x0) {
    _Var2 = stamp->tv_usec;
    p->tv_sec = stamp->tv_sec;
    p->tv_usec = _Var2;
    sVar5 = Curl_llist_count(timeoutlist);
    if (sVar5 == 0) {
      e = (curl_llist_element *)0x0;
    }
    else {
      pcVar8 = timeoutlist;
      pcVar1 = (curl_llist_element *)0x0;
      do {
        e = pcVar1;
        pcVar1 = pcVar8->head;
        if (pcVar1 == (curl_llist_element *)0x0) break;
        lVar6 = curlx_tvdiff(*(timeval *)pcVar1->ptr,*p);
        pcVar8 = (curl_llist *)&pcVar1->next;
      } while (lVar6 < 1);
    }
    uVar3 = Curl_llist_insert_next(timeoutlist,e,p);
    ptVar7 = (timeval *)(ulong)uVar3;
    if (uVar3 == 0) {
      CVar4 = (*Curl_cfree)(p);
      return CVar4;
    }
  }
  return (CURLMcode)ptVar7;
}

Assistant:

static CURLMcode
multi_addtimeout(struct curl_llist *timeoutlist,
                 struct timeval *stamp)
{
  struct curl_llist_element *e;
  struct timeval *timedup;
  struct curl_llist_element *prev = NULL;

  timedup = malloc(sizeof(*timedup));
  if(!timedup)
    return CURLM_OUT_OF_MEMORY;

  /* copy the timestamp */
  memcpy(timedup, stamp, sizeof(*timedup));

  if(Curl_llist_count(timeoutlist)) {
    /* find the correct spot in the list */
    for(e = timeoutlist->head; e; e = e->next) {
      struct timeval *checktime = e->ptr;
      long diff = curlx_tvdiff(*checktime, *timedup);
      if(diff > 0)
        break;
      prev = e;
    }

  }
  /* else
     this is the first timeout on the list */

  if(!Curl_llist_insert_next(timeoutlist, prev, timedup)) {
    free(timedup);
    return CURLM_OUT_OF_MEMORY;
  }

  return CURLM_OK;
}